

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Vec_Int_t * Saig_ManFindIsoPermCos(Aig_Man_t *pAig,Vec_Int_t *vPermCis)

{
  uint __line;
  int iVar1;
  Vec_Int_t *p;
  Vec_Ptr_t *p_00;
  void *Entry;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  char *__assertion;
  int iVar5;
  
  if (vPermCis->nSize != pAig->nObjs[2]) {
    __assertion = "Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig)";
    __line = 0x34;
LAB_0056acb4:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigIso.c"
                  ,__line,"Vec_Int_t *Saig_ManFindIsoPermCos(Aig_Man_t *, Vec_Int_t *)");
  }
  p = Vec_IntAlloc(pAig->nObjs[3]);
  if (pAig->nTruePos == 1) {
    Vec_IntPush(p,0);
  }
  else {
    p_00 = Vec_PtrAlloc(pAig->nTruePos);
    for (iVar4 = 0; iVar4 < pAig->nTruePos; iVar4 = iVar4 + 1) {
      Entry = Vec_PtrEntry(pAig->vCos,iVar4);
      uVar3 = *(ulong *)((long)Entry + 8) & 0xfffffffffffffffe;
      iVar5 = *(int *)(uVar3 + 0x28);
      if ((*(uint *)(uVar3 + 0x18) & 7) == 1) {
        if (iVar5 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
      }
      else if (iVar5 < 1) {
        __assertion = "Aig_ObjIsConst1(pFanin) || pFanin->iData > 0";
        __line = 0x3e;
        goto LAB_0056acb4;
      }
      *(uint *)((long)Entry + 0x28) = ((uint)*(ulong *)((long)Entry + 8) & 1) + iVar5 * 2;
      Vec_PtrPush(p_00,Entry);
    }
    Vec_PtrSort(p_00,Iso_ObjCompareByData);
    iVar4 = p_00->nSize;
    iVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
      iVar5 = 0;
    }
    for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
      piVar2 = (int *)Vec_PtrEntry(p_00,iVar5);
      if (0xfffffffd < (piVar2[6] & 7U) - 7) {
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      Vec_IntPush(p,*piVar2);
    }
    Vec_PtrFree(p_00);
  }
  iVar4 = pAig->nTruePis;
  iVar5 = pAig->nTruePos - iVar4;
  for (; iVar4 < vPermCis->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vPermCis,iVar4);
    Vec_IntPush(p,iVar1 + iVar5);
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the canonical permutation of the COs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManFindIsoPermCos( Aig_Man_t * pAig, Vec_Int_t * vPermCis )
{
    extern int Iso_ObjCompareByData( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 );
    Vec_Int_t * vPermCos;
    Aig_Obj_t * pObj, * pFanin;
    int i, Entry, Diff;
    assert( Vec_IntSize(vPermCis) == Aig_ManCiNum(pAig) );
    vPermCos = Vec_IntAlloc( Aig_ManCoNum(pAig) );
    if ( Saig_ManPoNum(pAig) == 1 )
        Vec_IntPush( vPermCos, 0 );
    else
    {
        Vec_Ptr_t * vRoots = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
        Saig_ManForEachPo( pAig, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            assert( Aig_ObjIsConst1(pFanin) || pFanin->iData > 0 );
            pObj->iData = Abc_Var2Lit( pFanin->iData, Aig_ObjFaninC0(pObj) );
            Vec_PtrPush( vRoots, pObj );
        }
        Vec_PtrSort( vRoots, (int (*)(void))Iso_ObjCompareByData );
        Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
            Vec_IntPush( vPermCos, Aig_ObjCioId(pObj) );
        Vec_PtrFree( vRoots );
    }
    // add flop outputs
    Diff = Saig_ManPoNum(pAig) - Saig_ManPiNum(pAig);
    Vec_IntForEachEntryStart( vPermCis, Entry, i, Saig_ManPiNum(pAig) )
        Vec_IntPush( vPermCos, Entry + Diff );
    return vPermCos;
}